

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractContentContext.h
# Opt level: O0

void __thiscall
SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::SomethingOrDouble(SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inSome)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *inSome_local;
  SomethingOrDouble<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_local;
  
  std::__cxx11::string::string((string *)this);
  std::__cxx11::string::operator=((string *)this,(string *)inSome);
  this->IsDouble = false;
  return;
}

Assistant:

SomethingOrDouble(T inSome){SomeValue = inSome;IsDouble = false;}